

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGGrammarPtr_conflict xmlRelaxNGParseGrammar(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  xmlRelaxNGGrammarPtr_conflict pxVar1;
  xmlRelaxNGGrammarPtr_conflict old;
  xmlRelaxNGGrammarPtr_conflict tmp;
  xmlRelaxNGGrammarPtr_conflict ret;
  xmlNodePtr nodes_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlRelaxNGParserCtxtPtr)xmlRelaxNGNewGrammar(ctxt);
  if (ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0) {
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    ctxt_local->userData = ctxt->grammar;
    if (ctxt->grammar != (xmlRelaxNGGrammarPtr_conflict)0x0) {
      old = ctxt->grammar->children;
      if (old == (xmlRelaxNGGrammarPtr)0x0) {
        ctxt->grammar->children = (xmlRelaxNGGrammarPtr)ctxt_local;
      }
      else {
        for (; old->next != (xmlRelaxNGGrammarPtr)0x0; old = old->next) {
        }
        old->next = (xmlRelaxNGGrammarPtr)ctxt_local;
      }
    }
    pxVar1 = ctxt->grammar;
    ctxt->grammar = (xmlRelaxNGGrammarPtr_conflict)ctxt_local;
    xmlRelaxNGParseGrammarContent(ctxt,nodes);
    ctxt->grammar = (xmlRelaxNGGrammarPtr_conflict)ctxt_local;
    if (ctxt->grammar == (xmlRelaxNGGrammarPtr_conflict)0x0) {
      xmlRngPErr(ctxt,nodes,0x40c,"Failed to parse <grammar> content\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    }
    else if (ctxt->grammar->start == (xmlRelaxNGDefinePtr_conflict)0x0) {
      xmlRngPErr(ctxt,nodes,0x40f,"Element <grammar> has no <start>\n",(xmlChar *)0x0,(xmlChar *)0x0
                );
    }
    xmlRelaxNGCombineStart(ctxt,(xmlRelaxNGGrammarPtr_conflict)ctxt_local);
    if (ctxt_local->grammar != (xmlRelaxNGGrammarPtr_conflict)0x0) {
      xmlHashScan((xmlHashTablePtr)ctxt_local->grammar,xmlRelaxNGCheckCombine,ctxt);
    }
    if (ctxt_local->parentgrammar != (xmlRelaxNGGrammarPtr_conflict)0x0) {
      xmlHashScan((xmlHashTablePtr)ctxt_local->parentgrammar,xmlRelaxNGCheckReference,ctxt);
    }
    ctxt->grammar = pxVar1;
  }
  return (xmlRelaxNGGrammarPtr_conflict)ctxt_local;
}

Assistant:

static xmlRelaxNGGrammarPtr
xmlRelaxNGParseGrammar(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes)
{
    xmlRelaxNGGrammarPtr ret, tmp, old;

    ret = xmlRelaxNGNewGrammar(ctxt);
    if (ret == NULL)
        return (NULL);

    /*
     * Link the new grammar in the tree
     */
    ret->parent = ctxt->grammar;
    if (ctxt->grammar != NULL) {
        tmp = ctxt->grammar->children;
        if (tmp == NULL) {
            ctxt->grammar->children = ret;
        } else {
            while (tmp->next != NULL)
                tmp = tmp->next;
            tmp->next = ret;
        }
    }

    old = ctxt->grammar;
    ctxt->grammar = ret;
    xmlRelaxNGParseGrammarContent(ctxt, nodes);
    ctxt->grammar = ret;
    if (ctxt->grammar == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_CONTENT,
                   "Failed to parse <grammar> content\n", NULL, NULL);
    } else if (ctxt->grammar->start == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_NO_START,
                   "Element <grammar> has no <start>\n", NULL, NULL);
    }

    /*
     * Apply 4.17 merging rules to defines and starts
     */
    xmlRelaxNGCombineStart(ctxt, ret);
    if (ret->defs != NULL) {
        xmlHashScan(ret->defs, xmlRelaxNGCheckCombine, ctxt);
    }

    /*
     * link together defines and refs in this grammar
     */
    if (ret->refs != NULL) {
        xmlHashScan(ret->refs, xmlRelaxNGCheckReference, ctxt);
    }


    /* @@@@ */

    ctxt->grammar = old;
    return (ret);
}